

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

void __thiscall
libsbox::Stream::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Stream *this,Value *value)

{
  ushort uVar1;
  ContextManager *pCVar2;
  allocator<char> local_39;
  string local_38 [32];
  
  uVar1 = (value->data_).f.flags;
  if (uVar1 != 0) {
    if ((uVar1 >> 10 & 1) == 0) {
      pCVar2 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>(local_38,"JSON is incorrect",&local_39);
      (*(code *)**(undefined8 **)pCVar2)(pCVar2,local_38);
      std::__cxx11::string::~string(local_38);
      uVar1 = (value->data_).f.flags;
    }
    if ((uVar1 >> 10 & 1) == 0) {
      pCVar2 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>(local_38,"JSON is incorrect",&local_39);
      (*(code *)**(undefined8 **)pCVar2)(pCVar2,local_38);
      std::__cxx11::string::~string(local_38);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GetString(value);
    std::__cxx11::string::assign((char *)this);
    return;
  }
  std::__cxx11::string::assign((char *)this);
  return;
}

Assistant:

void Stream::deserialize_request(const rapidjson::Value &value) {
    if (value.IsNull()) {
        filename_ = "";
    } else {
        CHECK_TYPE(value, String);
        GET(filename_, value, String);
    }
}